

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_14e767b::entry_to_remove::entry_to_remove
          (entry_to_remove *this,string *name,cmMakefile *makefile)

{
  cmValue cVar1;
  bool bVar2;
  string *psVar3;
  cmAlphaNum local_140;
  cmAlphaNum local_110;
  string local_e0;
  cmValue local_c0;
  cmValue prefix_value;
  cmAlphaNum local_78;
  string local_48;
  cmValue local_28;
  cmValue to_skip;
  cmMakefile *makefile_local;
  string *name_local;
  entry_to_remove *this_local;
  
  this->count = -1;
  to_skip.Value = (string *)makefile;
  std::__cxx11::string::string((string *)&this->value);
  cVar1.Value = to_skip.Value;
  cmAlphaNum::cmAlphaNum(&local_78,"_CMAKE_SYSTEM_PREFIX_PATH_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&prefix_value,name);
  cmStrCat<char[14]>(&local_48,&local_78,(cmAlphaNum *)&prefix_value,(char (*) [14])0xd49d95);
  local_28 = cmMakefile::GetDefinition(cVar1.Value,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = cmValue::operator_cast_to_bool(&local_28);
  if (bVar2) {
    psVar3 = cmValue::operator_cast_to_string_(&local_28);
    cmStrToLong(psVar3,&this->count);
  }
  cVar1.Value = to_skip.Value;
  cmAlphaNum::cmAlphaNum(&local_110,"_CMAKE_SYSTEM_PREFIX_PATH_");
  cmAlphaNum::cmAlphaNum(&local_140,name);
  cmStrCat<char[14]>(&local_e0,&local_110,&local_140,(char (*) [14])0xd49dc4);
  local_c0 = cmMakefile::GetDefinition(cVar1.Value,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  bVar2 = cmValue::operator_cast_to_bool(&local_c0);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_c0);
    std::__cxx11::string::operator=((string *)&this->value,(string *)psVar3);
  }
  return;
}

Assistant:

entry_to_remove(std::string const& name, cmMakefile* makefile)
    : value()
  {
    if (cmValue to_skip = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_COUNT"))) {
      cmStrToLong(to_skip, &count);
    }
    if (cmValue prefix_value = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_VALUE"))) {
      value = *prefix_value;
    }
  }